

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O1

nng_http_status nng_http_get_status(nng_http *conn)

{
  nng_http_status nVar1;
  
  nVar1 = nni_http_get_status(conn);
  return nVar1;
}

Assistant:

nng_http_status
nng_http_get_status(nng_http *conn)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_get_status(conn));
#else
	NNI_ARG_UNUSED(res);
	NNI_ARG_UNUSED(status);
	return (0);
#endif
}